

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testNativeFormat.cpp
# Opt level: O0

void testNativeFormat(string *tempDir)

{
  ostream *poVar1;
  exception *e;
  char *in_stack_00000058;
  string *in_stack_00000060;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Testing if incompressible pixel data are written in Xdr, not native format"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"image 1:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_1bdff2::readCopyRead(in_stack_00000060,in_stack_00000058,tempDir._4_4_);
  poVar1 = std::operator<<((ostream *)&std::cout,"image 2:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_1bdff2::readCopyRead(in_stack_00000060,in_stack_00000058,tempDir._4_4_);
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testNativeFormat (const std::string& tempDir)
{
    try
    {
        cout << "Testing if incompressible pixel data are written "
                "in Xdr, not native format"
             << endl;

        cout << "image 1:" << endl;
        readCopyRead (tempDir, ILM_IMF_TEST_IMAGEDIR "test_native1.exr", 54435);

        cout << "image 2:" << endl;
        readCopyRead (tempDir, ILM_IMF_TEST_IMAGEDIR "test_native2.exr", 37639);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}